

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

void __thiscall
helics::InterfaceInfo::createPublication
          (InterfaceInfo *this,InterfaceHandle handle,string_view key,string_view type,
          string_view units,uint16_t flags)

{
  bool bVar1;
  GlobalFederateId fed;
  DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *data_1;
  BaseType in_ESI;
  uint16_t in_stack_00000018;
  handle cpHandle;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  int32_t in_stack_fffffffffffffef8;
  int32_t in_stack_fffffffffffffefc;
  int32_t option;
  PublicationInfo *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *this_00;
  GlobalHandle *data;
  InterfaceHandle *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  undefined4 in_stack_ffffffffffffff70;
  GlobalHandle local_84 [2];
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  local_48 [2];
  InterfaceHandle local_4;
  
  this_00 = local_48;
  local_4.hid = in_ESI;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffffed8);
  data_1 = gmlc::libguarded::
           lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
           ::operator->(this_00);
  data = (GlobalHandle *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff20,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10
            );
  fed = std::atomic::operator_cast_to_GlobalFederateId
                  ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffed8);
  GlobalHandle::GlobalHandle(local_84,fed,local_4);
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
              *)CONCAT44(local_4.hid,in_stack_ffffffffffffff70),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60
             ,data,(basic_string_view<char,_std::char_traits<char>_> *)data_1,
             (basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000018,required_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    gmlc::containers::
    DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
    ::back((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
            *)0x514511);
    PublicationInfo::setProperty
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000018,optional_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    gmlc::containers::
    DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
    ::back((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
            *)0x5145c9);
    PublicationInfo::setProperty
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000018,buffer_data_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    in_stack_ffffffffffffff00 =
         gmlc::containers::
         DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
         ::back((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                 *)0x51461c);
    PublicationInfo::setProperty
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000018,only_transmit_on_change_flag);
  option = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    gmlc::containers::
    DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
    ::back((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
            *)0x514672);
    PublicationInfo::setProperty(in_stack_ffffffffffffff00,option,in_stack_fffffffffffffef8);
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000018,single_connection_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    gmlc::containers::
    DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
    ::back((DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
            *)0x5146c8);
    PublicationInfo::setProperty(in_stack_ffffffffffffff00,option,in_stack_fffffffffffffef8);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5146f4);
  return;
}

Assistant:

void InterfaceInfo::createPublication(InterfaceHandle handle,
                                      std::string_view key,
                                      std::string_view type,
                                      std::string_view units,
                                      std::uint16_t flags)
{
    auto cpHandle = publications.lock();
    cpHandle->insert(std::string(key), handle, GlobalHandle{global_id, handle}, key, type, units);
    if (checkActionFlag(flags, required_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, buffer_data_flag)) {
        cpHandle->back()->setProperty(defs::Options::BUFFER_DATA, 1);
    }
    if (checkActionFlag(flags, only_transmit_on_change_flag)) {
        cpHandle->back()->setProperty(defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE, 1);
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        cpHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
}